

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_empty_space.cpp
# Opt level: O1

Screen_mask * cppurses::detail::find_empty_space(Screen_mask *__return_storage_ptr__,Widget *w)

{
  pointer puVar1;
  Widget *pWVar2;
  _Bit_type *p_Var3;
  ulong *puVar4;
  unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *child;
  size_t sVar5;
  size_t sVar6;
  pointer puVar7;
  pointer puVar8;
  ulong *puVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  anon_class_8_1_a8d81ce6 widths_equal;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  
  puVar1 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = 0;
  puVar8 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar7 = puVar8; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pWVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
             super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
             super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
    if (pWVar2->enabled_ == true) {
      lVar13 = lVar13 + pWVar2->outer_height_;
    }
  }
  sVar14 = w->outer_height_;
  sVar5 = Border_offset::north(w);
  sVar6 = Border_offset::south(w);
  if (lVar13 == sVar14 - (sVar6 + sVar5)) {
    sVar14 = w->outer_width_;
    sVar5 = Border_offset::east(w);
    sVar6 = Border_offset::west(w);
    sVar14 = sVar14 - (sVar6 + sVar5);
    lVar13 = (long)puVar1 - (long)puVar8 >> 5;
    puVar7 = puVar8;
    if (0 < lVar13) {
      puVar7 = (pointer)((long)&(puVar8->_M_t).
                                super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                                .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl +
                        ((long)puVar1 - (long)puVar8 & 0xffffffffffffffe0U));
      lVar13 = lVar13 + 1;
      puVar10 = puVar8 + 2;
      do {
        pWVar2 = puVar10[-2]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar10 = puVar10 + -2;
          goto LAB_001523f4;
        }
        pWVar2 = puVar10[-1]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar10 = puVar10 + -1;
          goto LAB_001523f4;
        }
        pWVar2 = (puVar10->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) goto LAB_001523f4;
        pWVar2 = puVar10[1]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar10 = puVar10 + 1;
          goto LAB_001523f4;
        }
        lVar13 = lVar13 + -1;
        puVar10 = puVar10 + 4;
      } while (1 < lVar13);
    }
    lVar13 = (long)puVar1 - (long)puVar7 >> 3;
    if (lVar13 == 1) {
LAB_001523c5:
      pWVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      puVar10 = puVar1;
      if ((pWVar2->enabled_ == true) && (puVar10 = puVar7, pWVar2->outer_width_ == sVar14)) {
        puVar10 = puVar1;
      }
    }
    else if (lVar13 == 2) {
LAB_001523ac:
      pWVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar2->enabled_ != true) || (puVar10 = puVar7, pWVar2->outer_width_ == sVar14)) {
        puVar7 = puVar7 + 1;
        goto LAB_001523c5;
      }
    }
    else {
      puVar10 = puVar1;
      if ((lVar13 == 3) &&
         ((pWVar2 = (puVar7->_M_t).
                    super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                    .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl,
          pWVar2->enabled_ != true || (puVar10 = puVar7, pWVar2->outer_width_ == sVar14)))) {
        puVar7 = puVar7 + 1;
        goto LAB_001523ac;
      }
    }
LAB_001523f4:
    if (puVar10 != puVar1) goto LAB_001523fd;
LAB_001526a8:
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->area_).width = 0;
    (__return_storage_ptr__->area_).height = 0;
    (__return_storage_ptr__->offset_).x = 0;
    (__return_storage_ptr__->offset_).y = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_001523fd:
    lVar13 = 0;
    for (puVar7 = puVar8; puVar7 != puVar1; puVar7 = puVar7 + 1) {
      pWVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if (pWVar2->enabled_ == true) {
        lVar13 = lVar13 + pWVar2->outer_width_;
      }
    }
    sVar14 = w->outer_width_;
    sVar5 = Border_offset::east(w);
    sVar6 = Border_offset::west(w);
    if (lVar13 == sVar14 - (sVar6 + sVar5)) {
      sVar14 = w->outer_height_;
      sVar5 = Border_offset::north(w);
      sVar6 = Border_offset::south(w);
      sVar14 = sVar14 - (sVar6 + sVar5);
      lVar13 = (long)puVar1 - (long)puVar8 >> 5;
      puVar7 = puVar8;
      if (0 < lVar13) {
        puVar7 = (pointer)((long)&(puVar8->_M_t).
                                  super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                                  .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl +
                          ((long)puVar1 - (long)puVar8 & 0xffffffffffffffe0U));
        lVar13 = lVar13 + 1;
        puVar8 = puVar8 + 2;
        do {
          pWVar2 = puVar8[-2]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar8 = puVar8 + -2;
            goto LAB_00152591;
          }
          pWVar2 = puVar8[-1]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar8 = puVar8 + -1;
            goto LAB_00152591;
          }
          pWVar2 = (puVar8->_M_t).
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) goto LAB_00152591;
          pWVar2 = puVar8[1]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar8 = puVar8 + 1;
            goto LAB_00152591;
          }
          lVar13 = lVar13 + -1;
          puVar8 = puVar8 + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)puVar1 - (long)puVar7 >> 3;
      if (lVar13 == 1) {
LAB_00152561:
        pWVar2 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        puVar8 = puVar1;
        if ((pWVar2->enabled_ == true) && (puVar8 = puVar7, pWVar2->outer_height_ == sVar14)) {
          puVar8 = puVar1;
        }
      }
      else if (lVar13 == 2) {
LAB_00152547:
        pWVar2 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (puVar8 = puVar7, pWVar2->outer_height_ == sVar14)) {
          puVar7 = puVar7 + 1;
          goto LAB_00152561;
        }
      }
      else {
        puVar8 = puVar1;
        if ((lVar13 == 3) &&
           ((pWVar2 = (puVar7->_M_t).
                      super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                      .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl,
            pWVar2->enabled_ != true || (puVar8 = puVar7, pWVar2->outer_height_ == sVar14)))) {
          puVar7 = puVar7 + 1;
          goto LAB_00152547;
        }
      }
LAB_00152591:
      if (puVar8 == puVar1) goto LAB_001526a8;
    }
    Screen_mask::Screen_mask(__return_storage_ptr__,w,Inner);
    puVar1 = (w->children).children_.
             super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (w->children).children_.
                  super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pWVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar2->enabled_ == true) &&
         (uVar15 = (pWVar2->top_left_position_).y, uVar15 < pWVar2->outer_height_ + uVar15)) {
        p_Var3 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        do {
          sVar14 = (pWVar2->top_left_position_).x;
          uVar11 = pWVar2->outer_width_ + sVar14;
          for (; sVar14 < uVar11; sVar14 = sVar14 + 1) {
            lVar13 = (uVar15 - (__return_storage_ptr__->offset_).y) *
                     (__return_storage_ptr__->area_).width - (__return_storage_ptr__->offset_).x;
            uVar12 = sVar14 + lVar13;
            uVar11 = sVar14 + 0x3f + lVar13;
            if (-1 < (long)uVar12) {
              uVar11 = uVar12;
            }
            puVar9 = p_Var3 + ((long)uVar11 >> 6) +
                              (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) +
                              0xffffffffffffffff;
            *puVar9 = *puVar9 | 1L << ((byte)uVar12 & 0x3f);
            uVar11 = pWVar2->outer_width_ + (pWVar2->top_left_position_).x;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < pWVar2->outer_height_ + (pWVar2->top_left_position_).y);
      }
    }
    puVar4 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
    for (puVar9 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl
                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p; puVar9 != puVar4
        ; puVar9 = puVar9 + 1) {
      *puVar9 = ~*puVar9;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Screen_mask find_empty_space(const Widget& w) {
    if (children_completely_cover(w)) {
        return Screen_mask{};
    }
    auto mask = Screen_mask{w, Screen_mask::Inner};
    mark_covered_tiles(w, mask);
    mask.flip();
    return mask;
}